

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChContinuumMaterial.cpp
# Opt level: O1

void __thiscall
chrono::fea::ChContinuumElastic::ComputeElasticStress
          (ChContinuumElastic *this,ChStressTensor<double> *mstress,ChStrainTensor<double> *mstrain)

{
  double dVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  
  auVar8._8_8_ = 0;
  auVar8._0_8_ = this->l;
  auVar11 = ZEXT816(0x4000000000000000);
  auVar12._8_8_ = 0;
  auVar12._0_8_ = this->G;
  auVar7 = vfmadd132sd_fma(auVar12,auVar8,auVar11);
  auVar2._8_8_ = 0;
  auVar2._0_8_ = (mstrain->super_ChVoightTensor<double>).super_ChVectorN<double,_6>.
                 super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
                 [0];
  auVar16._8_8_ = 0;
  auVar16._0_8_ =
       this->l * (mstrain->super_ChVoightTensor<double>).super_ChVectorN<double,_6>.
                 super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
                 [1];
  auVar2 = vfmadd231sd_fma(auVar16,auVar7,auVar2);
  auVar7._8_8_ = 0;
  auVar7._0_8_ = (mstrain->super_ChVoightTensor<double>).super_ChVectorN<double,_6>.
                 super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
                 [2];
  auVar2 = vfmadd231sd_fma(auVar2,auVar8,auVar7);
  (mstress->super_ChVoightTensor<double>).super_ChVectorN<double,_6>.
  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[0] =
       auVar2._0_8_;
  auVar9._8_8_ = 0;
  auVar9._0_8_ = this->l;
  auVar13._8_8_ = 0;
  auVar13._0_8_ = this->G;
  auVar2 = vfmadd132sd_fma(auVar13,auVar9,auVar11);
  auVar3._8_8_ = 0;
  auVar3._0_8_ = (mstrain->super_ChVoightTensor<double>).super_ChVectorN<double,_6>.
                 super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
                 [0];
  auVar14._8_8_ = 0;
  auVar14._0_8_ =
       auVar2._0_8_ *
       (mstrain->super_ChVoightTensor<double>).super_ChVectorN<double,_6>.
       super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[1];
  auVar2 = vfmadd231sd_fma(auVar14,auVar9,auVar3);
  auVar4._8_8_ = 0;
  auVar4._0_8_ = (mstrain->super_ChVoightTensor<double>).super_ChVectorN<double,_6>.
                 super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
                 [2];
  auVar2 = vfmadd231sd_fma(auVar2,auVar9,auVar4);
  (mstress->super_ChVoightTensor<double>).super_ChVectorN<double,_6>.
  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[1] =
       auVar2._0_8_;
  auVar10._8_8_ = 0;
  auVar10._0_8_ = this->l;
  auVar5._8_8_ = 0;
  auVar5._0_8_ = (mstrain->super_ChVoightTensor<double>).super_ChVectorN<double,_6>.
                 super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
                 [0];
  auVar15._8_8_ = 0;
  auVar15._0_8_ =
       this->l * (mstrain->super_ChVoightTensor<double>).super_ChVectorN<double,_6>.
                 super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
                 [1];
  auVar7 = vfmadd231sd_fma(auVar15,auVar10,auVar5);
  auVar6._8_8_ = 0;
  auVar6._0_8_ = this->G;
  auVar2 = vfmadd132sd_fma(auVar11,auVar10,auVar6);
  auVar11._8_8_ = 0;
  auVar11._0_8_ =
       (mstrain->super_ChVoightTensor<double>).super_ChVectorN<double,_6>.
       super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[2];
  auVar2 = vfmadd132sd_fma(auVar2,auVar7,auVar11);
  (mstress->super_ChVoightTensor<double>).super_ChVectorN<double,_6>.
  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[2] =
       auVar2._0_8_;
  dVar1 = (mstrain->super_ChVoightTensor<double>).super_ChVectorN<double,_6>.
          super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[3];
  (mstress->super_ChVoightTensor<double>).super_ChVectorN<double,_6>.
  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[3] =
       (dVar1 + dVar1) * this->G;
  dVar1 = (mstrain->super_ChVoightTensor<double>).super_ChVectorN<double,_6>.
          super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[4];
  (mstress->super_ChVoightTensor<double>).super_ChVectorN<double,_6>.
  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[4] =
       (dVar1 + dVar1) * this->G;
  dVar1 = (mstrain->super_ChVoightTensor<double>).super_ChVectorN<double,_6>.
          super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[5];
  (mstress->super_ChVoightTensor<double>).super_ChVectorN<double,_6>.
  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[5] =
       (dVar1 + dVar1) * this->G;
  return;
}

Assistant:

void ChContinuumElastic::ComputeElasticStress(ChStressTensor<>& mstress, const ChStrainTensor<>& mstrain) const {
    mstress.XX() = mstrain.XX() * (l + 2 * G) + mstrain.YY() * l + mstrain.ZZ() * l;
    mstress.YY() = mstrain.XX() * l + mstrain.YY() * (l + 2 * G) + mstrain.ZZ() * l;
    mstress.ZZ() = mstrain.XX() * l + mstrain.YY() * l + mstrain.ZZ() * (l + 2 * G);
    mstress.XY() = mstrain.XY() * 2 * G;
    mstress.XZ() = mstrain.XZ() * 2 * G;
    mstress.YZ() = mstrain.YZ() * 2 * G;
}